

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O2

void __thiscall deci::array_t::array_t(array_t *this,array_t *copy)

{
  pointer ppvVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppvVar3;
  value_t *local_30;
  
  (this->super_value_t).hash = 1;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_00108d00;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::reserve
            (&this->elements,
             (long)(copy->elements).
                   super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(copy->elements).
                   super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  ppvVar1 = (copy->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar3 = (copy->elements).
                 super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppvVar3 != ppvVar1; ppvVar3 = ppvVar3 + 1) {
    iVar2 = (*(*ppvVar3)->_vptr_value_t[2])();
    local_30 = (value_t *)CONCAT44(extraout_var,iVar2);
    std::vector<deci::value_t*,std::allocator<deci::value_t*>>::emplace_back<deci::value_t*>
              ((vector<deci::value_t*,std::allocator<deci::value_t*>> *)&this->elements,&local_30);
  }
  return;
}

Assistant:

array_t::array_t(const array_t& copy):value_t(),elements() {
      this->elements.reserve(copy.elements.size());
      for (auto el: copy.elements) {
        this->elements.push_back(el->Copy());
      }
    }